

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Geometry *this;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  size_t i;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  long local_1030;
  long local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar2 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  }
  pauVar18 = (undefined1 (*) [16])local_f68;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar1;
  local_f98._0_4_ = uVar1;
  local_f98._8_4_ = uVar1;
  local_f98._12_4_ = uVar1;
  auVar42 = ZEXT1664(local_f98);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar1;
  local_fa8._0_4_ = uVar1;
  local_fa8._8_4_ = uVar1;
  local_fa8._12_4_ = uVar1;
  auVar43 = ZEXT1664(local_fa8);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar1;
  local_fb8._0_4_ = uVar1;
  local_fb8._8_4_ = uVar1;
  local_fb8._12_4_ = uVar1;
  auVar44 = ZEXT1664(local_fb8);
  uVar1 = *(undefined4 *)&(context->query_radius).field_0;
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  bVar14 = false;
  do {
    local_fc8 = vsubps_avx(auVar42._0_16_,auVar23);
    fVar6 = auVar23._0_4_;
    fVar7 = auVar23._4_4_;
    fVar8 = auVar23._8_4_;
    fVar9 = auVar23._12_4_;
    local_fd8 = auVar42._0_4_ + fVar6;
    fStack_fd4 = auVar42._4_4_ + fVar7;
    fStack_fd0 = auVar42._8_4_ + fVar8;
    fStack_fcc = auVar42._12_4_ + fVar9;
    local_fe8 = vsubps_avx(auVar43._0_16_,auVar25);
    local_ff8 = auVar43._0_4_ + auVar25._0_4_;
    fStack_ff4 = auVar43._4_4_ + auVar25._4_4_;
    fStack_ff0 = auVar43._8_4_ + auVar25._8_4_;
    fStack_fec = auVar43._12_4_ + auVar25._12_4_;
    local_1008 = vsubps_avx(auVar44._0_16_,auVar29);
    local_1018._0_4_ = auVar44._0_4_ + auVar29._0_4_;
    local_1018._4_4_ = auVar44._4_4_ + auVar29._4_4_;
    local_1018._8_4_ = auVar44._8_4_ + auVar29._8_4_;
    local_1018._12_4_ = auVar44._12_4_ + auVar29._12_4_;
    local_f88._0_4_ = fVar6 * fVar6;
    local_f88._4_4_ = fVar7 * fVar7;
    local_f88._8_4_ = fVar8 * fVar8;
    local_f88._12_4_ = fVar9 * fVar9;
    auVar45 = ZEXT1664(local_f88);
LAB_00b7e9ca:
    do {
      do {
        if (pauVar18 == (undefined1 (*) [16])&local_f78) {
          return bVar14;
        }
        pauVar12 = pauVar18 + -1;
        pauVar18 = pauVar18 + -1;
      } while ((float)local_1048._0_4_ < *(float *)(*pauVar12 + 8));
      uVar19 = *(ulong *)*pauVar18;
LAB_00b7e9ea:
      uVar16 = (uint)uVar19;
      auVar23 = auVar42._0_16_;
      auVar25 = auVar43._0_16_;
      auVar29 = auVar44._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar19 & 8) != 0) goto LAB_00b7edea;
        uVar15 = uVar19 & 0xfffffffffffffff0;
        fVar6 = query->time;
        auVar22._4_4_ = fVar6;
        auVar22._0_4_ = fVar6;
        auVar22._8_4_ = fVar6;
        auVar22._12_4_ = fVar6;
        auVar31._0_4_ = fVar6 * *(float *)(uVar15 + 0x80) + *(float *)(uVar15 + 0x20);
        auVar31._4_4_ = fVar6 * *(float *)(uVar15 + 0x84) + *(float *)(uVar15 + 0x24);
        auVar31._8_4_ = fVar6 * *(float *)(uVar15 + 0x88) + *(float *)(uVar15 + 0x28);
        auVar31._12_4_ = fVar6 * *(float *)(uVar15 + 0x8c) + *(float *)(uVar15 + 0x2c);
        auVar34._0_4_ = fVar6 * *(float *)(uVar15 + 0xa0) + *(float *)(uVar15 + 0x40);
        auVar34._4_4_ = fVar6 * *(float *)(uVar15 + 0xa4) + *(float *)(uVar15 + 0x44);
        auVar34._8_4_ = fVar6 * *(float *)(uVar15 + 0xa8) + *(float *)(uVar15 + 0x48);
        auVar34._12_4_ = fVar6 * *(float *)(uVar15 + 0xac) + *(float *)(uVar15 + 0x4c);
        auVar27._0_4_ = fVar6 * *(float *)(uVar15 + 0xc0) + *(float *)(uVar15 + 0x60);
        auVar27._4_4_ = fVar6 * *(float *)(uVar15 + 0xc4) + *(float *)(uVar15 + 100);
        auVar27._8_4_ = fVar6 * *(float *)(uVar15 + 200) + *(float *)(uVar15 + 0x68);
        auVar27._12_4_ = fVar6 * *(float *)(uVar15 + 0xcc) + *(float *)(uVar15 + 0x6c);
        auVar36._0_4_ = fVar6 * *(float *)(uVar15 + 0x90) + *(float *)(uVar15 + 0x30);
        auVar36._4_4_ = fVar6 * *(float *)(uVar15 + 0x94) + *(float *)(uVar15 + 0x34);
        auVar36._8_4_ = fVar6 * *(float *)(uVar15 + 0x98) + *(float *)(uVar15 + 0x38);
        auVar36._12_4_ = fVar6 * *(float *)(uVar15 + 0x9c) + *(float *)(uVar15 + 0x3c);
        auVar39._0_4_ = fVar6 * *(float *)(uVar15 + 0xb0) + *(float *)(uVar15 + 0x50);
        auVar39._4_4_ = fVar6 * *(float *)(uVar15 + 0xb4) + *(float *)(uVar15 + 0x54);
        auVar39._8_4_ = fVar6 * *(float *)(uVar15 + 0xb8) + *(float *)(uVar15 + 0x58);
        auVar39._12_4_ = fVar6 * *(float *)(uVar15 + 0xbc) + *(float *)(uVar15 + 0x5c);
        auVar41._0_4_ = fVar6 * *(float *)(uVar15 + 0xd0) + *(float *)(uVar15 + 0x70);
        auVar41._4_4_ = fVar6 * *(float *)(uVar15 + 0xd4) + *(float *)(uVar15 + 0x74);
        auVar41._8_4_ = fVar6 * *(float *)(uVar15 + 0xd8) + *(float *)(uVar15 + 0x78);
        auVar41._12_4_ = fVar6 * *(float *)(uVar15 + 0xdc) + *(float *)(uVar15 + 0x7c);
        auVar10 = vmaxps_avx(auVar23,auVar31);
        auVar10 = vminps_avx(auVar10,auVar36);
        auVar10 = vsubps_avx(auVar10,auVar23);
        auVar23 = vmaxps_avx(auVar25,auVar34);
        auVar23 = vminps_avx(auVar23,auVar39);
        auVar25 = vsubps_avx(auVar23,auVar25);
        auVar23 = vmaxps_avx(auVar29,auVar27);
        auVar23 = vminps_avx(auVar23,auVar41);
        auVar23 = vsubps_avx(auVar23,auVar29);
        local_1058._4_4_ =
             auVar23._4_4_ * auVar23._4_4_ +
             auVar25._4_4_ * auVar25._4_4_ + auVar10._4_4_ * auVar10._4_4_;
        local_1058._0_4_ =
             auVar23._0_4_ * auVar23._0_4_ +
             auVar25._0_4_ * auVar25._0_4_ + auVar10._0_4_ * auVar10._0_4_;
        fStack_1050 = auVar23._8_4_ * auVar23._8_4_ +
                      auVar25._8_4_ * auVar25._8_4_ + auVar10._8_4_ * auVar10._8_4_;
        fStack_104c = auVar23._12_4_ * auVar23._12_4_ +
                      auVar25._12_4_ * auVar25._12_4_ + auVar10._12_4_ * auVar10._12_4_;
        auVar23 = vcmpps_avx(auVar31,auVar36,2);
        auVar25 = vcmpps_avx(auVar39,local_fe8,5);
        auVar23 = vandps_avx(auVar23,auVar25);
        auVar11._4_4_ = fStack_fd4;
        auVar11._0_4_ = local_fd8;
        auVar11._8_4_ = fStack_fd0;
        auVar11._12_4_ = fStack_fcc;
        auVar25 = vcmpps_avx(auVar31,auVar11,2);
        auVar10._4_4_ = fStack_ff4;
        auVar10._0_4_ = local_ff8;
        auVar10._8_4_ = fStack_ff0;
        auVar10._12_4_ = fStack_fec;
        auVar29 = vcmpps_avx(auVar34,auVar10,2);
        auVar25 = vandps_avx(auVar29,auVar25);
        auVar29 = vcmpps_avx(auVar41,local_1008,5);
        auVar23 = vandps_avx(auVar23,auVar29);
        auVar29 = vcmpps_avx(auVar36,local_fc8,5);
        auVar10 = vcmpps_avx(auVar27,local_1018,2);
        auVar29 = vandps_avx(auVar10,auVar29);
        auVar25 = vandps_avx(auVar25,auVar29);
        auVar23 = vandps_avx(auVar25,auVar23);
        if ((uVar16 & 7) == 6) {
LAB_00b7ec0a:
          auVar25 = vcmpps_avx(*(undefined1 (*) [16])((uVar19 & 0xfffffffffffffff0) + 0xe0),auVar22,
                               2);
          auVar29 = vcmpps_avx(auVar22,*(undefined1 (*) [16])((uVar19 & 0xfffffffffffffff0) + 0xf0),
                               1);
          auVar25 = vandps_avx(auVar25,auVar29);
          auVar23 = vandps_avx(auVar25,auVar23);
          auVar23 = vpslld_avx(auVar23,0x1f);
        }
        else {
          auVar23 = vpslld_avx(auVar23,0x1f);
        }
        uVar16 = vmovmskps_avx(auVar23);
LAB_00b7eabc:
        if (uVar16 != 0) {
          uVar15 = uVar19 & 0xfffffffffffffff0;
          lVar20 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar15 + lVar20 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          if (uVar16 != 0) {
            uVar3 = *(uint *)(local_1058 + lVar20 * 4);
            lVar20 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar15 + lVar20 * 8);
            uVar4 = *(uint *)(local_1058 + lVar20 * 4);
            uVar16 = uVar16 - 1 & uVar16;
            if (uVar16 == 0) {
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar18 = uVar5;
                *(uint *)(*pauVar18 + 8) = uVar4;
                pauVar18 = pauVar18 + 1;
              }
              else {
                *(ulong *)*pauVar18 = uVar19;
                *(uint *)(*pauVar18 + 8) = uVar3;
                pauVar18 = pauVar18 + 1;
                uVar19 = uVar5;
              }
            }
            else {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar19;
              auVar23 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar3));
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar5;
              auVar25 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar4));
              lVar20 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)(uVar15 + lVar20 * 8);
              auVar10 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_1058 + lVar20 * 4)));
              auVar29 = vpcmpgtd_avx(auVar25,auVar23);
              uVar16 = uVar16 - 1 & uVar16;
              if (uVar16 == 0) {
                auVar22 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar25,auVar23,auVar22);
                auVar23 = vblendvps_avx(auVar23,auVar25,auVar22);
                auVar25 = vpcmpgtd_avx(auVar10,auVar29);
                auVar22 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar10,auVar29,auVar22);
                auVar29 = vblendvps_avx(auVar29,auVar10,auVar22);
                auVar10 = vpcmpgtd_avx(auVar29,auVar23);
                auVar22 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar29,auVar23,auVar22);
                auVar23 = vblendvps_avx(auVar23,auVar29,auVar22);
                *pauVar18 = auVar23;
                pauVar18[1] = auVar10;
                uVar19 = auVar25._0_8_;
                pauVar18 = pauVar18 + 2;
              }
              else {
                lVar20 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar15 + lVar20 * 8);
                auVar26 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_1058 + lVar20 * 4)));
                auVar22 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar25,auVar23,auVar22);
                auVar23 = vblendvps_avx(auVar23,auVar25,auVar22);
                auVar25 = vpcmpgtd_avx(auVar26,auVar10);
                auVar22 = vpshufd_avx(auVar25,0xaa);
                auVar25 = vblendvps_avx(auVar26,auVar10,auVar22);
                auVar10 = vblendvps_avx(auVar10,auVar26,auVar22);
                auVar22 = vpcmpgtd_avx(auVar10,auVar23);
                auVar26 = vpshufd_avx(auVar22,0xaa);
                auVar22 = vblendvps_avx(auVar10,auVar23,auVar26);
                auVar23 = vblendvps_avx(auVar23,auVar10,auVar26);
                auVar10 = vpcmpgtd_avx(auVar25,auVar29);
                auVar26 = vpshufd_avx(auVar10,0xaa);
                auVar10 = vblendvps_avx(auVar25,auVar29,auVar26);
                auVar25 = vblendvps_avx(auVar29,auVar25,auVar26);
                auVar29 = vpcmpgtd_avx(auVar22,auVar25);
                auVar26 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar22,auVar25,auVar26);
                auVar25 = vblendvps_avx(auVar25,auVar22,auVar26);
                *pauVar18 = auVar23;
                pauVar18[1] = auVar25;
                pauVar18[2] = auVar29;
                uVar19 = auVar10._0_8_;
                pauVar18 = pauVar18 + 3;
              }
            }
          }
          goto LAB_00b7e9ea;
        }
        goto LAB_00b7e9ca;
      }
      if ((uVar19 & 8) == 0) {
        uVar15 = uVar19 & 0xfffffffffffffff0;
        fVar6 = query->time;
        auVar22._4_4_ = fVar6;
        auVar22._0_4_ = fVar6;
        auVar22._8_4_ = fVar6;
        auVar22._12_4_ = fVar6;
        auVar26._0_4_ = fVar6 * *(float *)(uVar15 + 0x80) + *(float *)(uVar15 + 0x20);
        auVar26._4_4_ = fVar6 * *(float *)(uVar15 + 0x84) + *(float *)(uVar15 + 0x24);
        auVar26._8_4_ = fVar6 * *(float *)(uVar15 + 0x88) + *(float *)(uVar15 + 0x28);
        auVar26._12_4_ = fVar6 * *(float *)(uVar15 + 0x8c) + *(float *)(uVar15 + 0x2c);
        auVar30._0_4_ = fVar6 * *(float *)(uVar15 + 0xa0) + *(float *)(uVar15 + 0x40);
        auVar30._4_4_ = fVar6 * *(float *)(uVar15 + 0xa4) + *(float *)(uVar15 + 0x44);
        auVar30._8_4_ = fVar6 * *(float *)(uVar15 + 0xa8) + *(float *)(uVar15 + 0x48);
        auVar30._12_4_ = fVar6 * *(float *)(uVar15 + 0xac) + *(float *)(uVar15 + 0x4c);
        auVar33._0_4_ = fVar6 * *(float *)(uVar15 + 0xc0) + *(float *)(uVar15 + 0x60);
        auVar33._4_4_ = fVar6 * *(float *)(uVar15 + 0xc4) + *(float *)(uVar15 + 100);
        auVar33._8_4_ = fVar6 * *(float *)(uVar15 + 200) + *(float *)(uVar15 + 0x68);
        auVar33._12_4_ = fVar6 * *(float *)(uVar15 + 0xcc) + *(float *)(uVar15 + 0x6c);
        auVar35._0_4_ = fVar6 * *(float *)(uVar15 + 0x90) + *(float *)(uVar15 + 0x30);
        auVar35._4_4_ = fVar6 * *(float *)(uVar15 + 0x94) + *(float *)(uVar15 + 0x34);
        auVar35._8_4_ = fVar6 * *(float *)(uVar15 + 0x98) + *(float *)(uVar15 + 0x38);
        auVar35._12_4_ = fVar6 * *(float *)(uVar15 + 0x9c) + *(float *)(uVar15 + 0x3c);
        auVar38._0_4_ = fVar6 * *(float *)(uVar15 + 0xb0) + *(float *)(uVar15 + 0x50);
        auVar38._4_4_ = fVar6 * *(float *)(uVar15 + 0xb4) + *(float *)(uVar15 + 0x54);
        auVar38._8_4_ = fVar6 * *(float *)(uVar15 + 0xb8) + *(float *)(uVar15 + 0x58);
        auVar38._12_4_ = fVar6 * *(float *)(uVar15 + 0xbc) + *(float *)(uVar15 + 0x5c);
        auVar40._0_4_ = fVar6 * *(float *)(uVar15 + 0xd0) + *(float *)(uVar15 + 0x70);
        auVar40._4_4_ = fVar6 * *(float *)(uVar15 + 0xd4) + *(float *)(uVar15 + 0x74);
        auVar40._8_4_ = fVar6 * *(float *)(uVar15 + 0xd8) + *(float *)(uVar15 + 0x78);
        auVar40._12_4_ = fVar6 * *(float *)(uVar15 + 0xdc) + *(float *)(uVar15 + 0x7c);
        auVar10 = vmaxps_avx(auVar23,auVar26);
        auVar10 = vminps_avx(auVar10,auVar35);
        auVar10 = vsubps_avx(auVar10,auVar23);
        auVar23 = vmaxps_avx(auVar25,auVar30);
        auVar23 = vminps_avx(auVar23,auVar38);
        auVar25 = vsubps_avx(auVar23,auVar25);
        auVar23 = vmaxps_avx(auVar29,auVar33);
        auVar23 = vminps_avx(auVar23,auVar40);
        auVar23 = vsubps_avx(auVar23,auVar29);
        local_1058._0_4_ =
             auVar10._0_4_ * auVar10._0_4_ + auVar25._0_4_ * auVar25._0_4_ +
             auVar23._0_4_ * auVar23._0_4_;
        local_1058._4_4_ =
             auVar10._4_4_ * auVar10._4_4_ + auVar25._4_4_ * auVar25._4_4_ +
             auVar23._4_4_ * auVar23._4_4_;
        fStack_1050 = auVar10._8_4_ * auVar10._8_4_ + auVar25._8_4_ * auVar25._8_4_ +
                      auVar23._8_4_ * auVar23._8_4_;
        fStack_104c = auVar10._12_4_ * auVar10._12_4_ + auVar25._12_4_ * auVar25._12_4_ +
                      auVar23._12_4_ * auVar23._12_4_;
        auVar23 = vcmpps_avx(_local_1058,auVar45._0_16_,2);
        auVar25 = vcmpps_avx(auVar26,auVar35,2);
        auVar23 = vandps_avx(auVar23,auVar25);
        if ((uVar16 & 7) == 6) goto LAB_00b7ec0a;
        uVar16 = vmovmskps_avx(auVar23);
        goto LAB_00b7eabc;
      }
LAB_00b7edea:
      local_1030 = (ulong)(uVar16 & 0xf) - 8;
      lVar20 = (uVar19 & 0xfffffffffffffff0) + 0x50;
      local_1020 = 0;
      for (local_1028 = 0; local_1028 != local_1030; local_1028 = local_1028 + 1) {
        bVar17 = 0;
        for (lVar21 = 0; (lVar21 != 4 && (*(int *)(lVar20 + lVar21 * 4) != -1)); lVar21 = lVar21 + 1
            ) {
          uVar16 = *(uint *)(lVar20 + -0x10 + lVar21 * 4);
          this = (context->scene->geometries).items[uVar16].ptr;
          context->geomID = uVar16;
          context->primID = *(uint *)(lVar20 + lVar21 * 4);
          bVar13 = Geometry::pointQuery(this,query,context);
          auVar45 = ZEXT1664(local_f88);
          auVar44 = ZEXT1664(local_fb8);
          auVar43 = ZEXT1664(local_fa8);
          auVar42 = ZEXT1664(local_f98);
          bVar17 = bVar17 | bVar13;
        }
        local_1020 = CONCAT71((int7)(local_1020 >> 8),(byte)local_1020 | bVar17);
        lVar20 = lVar20 + 0x60;
      }
    } while ((local_1020 & 1) == 0);
    uVar1 = *(undefined4 *)&(context->query_radius).field_0;
    auVar23._4_4_ = uVar1;
    auVar23._0_4_ = uVar1;
    auVar23._8_4_ = uVar1;
    auVar23._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar25._4_4_ = uVar1;
    auVar25._0_4_ = uVar1;
    auVar25._8_4_ = uVar1;
    auVar25._12_4_ = uVar1;
    uVar1 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar29._4_4_ = uVar1;
    auVar29._0_4_ = uVar1;
    auVar29._8_4_ = uVar1;
    auVar29._12_4_ = uVar1;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    bVar14 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }